

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferPtr xmlOutputBufferCreateFd(int fd,xmlCharEncodingHandlerPtr encoder)

{
  int *piVar1;
  xmlFdIOCtxt *fdctxt;
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  xmlOutputBufferPtr pxStack_10;
  int fd_local;
  
  if (fd < 0) {
    xmlCharEncCloseFunc(encoder);
    pxStack_10 = (xmlOutputBufferPtr)0x0;
  }
  else {
    pxStack_10 = xmlAllocOutputBuffer(encoder);
    if (pxStack_10 != (xmlOutputBufferPtr)0x0) {
      piVar1 = (int *)(*xmlMalloc)(4);
      if (piVar1 == (int *)0x0) {
        pxStack_10 = (xmlOutputBufferPtr)0x0;
      }
      else {
        *piVar1 = fd;
        pxStack_10->context = piVar1;
        pxStack_10->writecallback = xmlFdWrite;
        pxStack_10->closecallback = xmlFdFree;
      }
    }
  }
  return pxStack_10;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateFd(int fd, xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (fd < 0) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        xmlFdIOCtxt *fdctxt;

        fdctxt = xmlMalloc(sizeof(*fdctxt));
        if (fdctxt == NULL) {
            return(NULL);
        }
        fdctxt->fd = fd;

        ret->context = fdctxt;
	ret->writecallback = xmlFdWrite;
        ret->closecallback = xmlFdFree;
    }

    return(ret);
}